

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTextureShadowTests.cpp
# Opt level: O2

bool vkt::texture::anon_unknown_0::verifyTexCompareResult<tcu::Texture2DArray>
               (TestContext *testCtx,ConstPixelBufferAccess *result,Texture2DArray *src,
               float *texCoord,ReferenceParams *sampleParams,TexComparePrecision *comparePrec,
               LodPrecision *lodPrec,PixelFormat *pixelFormat)

{
  vector<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
  *this;
  ReferenceParams *sampleParams_00;
  TexComparePrecision *comparePrec_00;
  bool bVar1;
  int iVar2;
  string *src_00;
  Surface *pSVar3;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  void *__buf_02;
  long lVar4;
  TestLog *this_00;
  long lVar5;
  ChannelOrder __fd;
  int level;
  long lVar6;
  allocator<char> local_32c;
  allocator<char> local_32b;
  allocator<char> local_32a;
  allocator<char> local_329;
  float *local_328;
  Vec3 local_320;
  Surface reference;
  undefined1 local_2f8 [40];
  string local_2d0;
  ReferenceParams *local_2b0;
  TexComparePrecision *local_2a8;
  TestLog *local_2a0;
  string local_298;
  string local_278;
  Surface errorMask;
  LogImage local_240;
  Texture2DArray clampedSource;
  
  this_00 = testCtx->m_log;
  local_328 = texCoord;
  tcu::Surface::Surface(&reference,(result->m_size).m_data[0],(result->m_size).m_data[1]);
  tcu::Surface::Surface(&errorMask,(result->m_size).m_data[0],(result->m_size).m_data[1]);
  local_2f8._0_4_ = pixelFormat->redBits;
  local_2f8._4_4_ = pixelFormat->greenBits;
  local_2f8._8_8_ = *(undefined8 *)&pixelFormat->blueBits;
  tcu::operator-((tcu *)&local_240,(Vector<int,_4> *)local_2f8,1);
  tcu::computeFixedPointThreshold((tcu *)&clampedSource,(IVec4 *)&local_240);
  local_320.m_data[2] =
       clampedSource.super_TextureLevelPyramid.m_data.
       super__Vector_base<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
       ._M_impl.super__Vector_impl_data._M_start._4_4_;
  bVar1 = isFloatingPointDepthFormat((TextureFormat *)src);
  if (bVar1) {
    local_2b0 = sampleParams;
    local_2a8 = comparePrec;
    local_2a0 = this_00;
    tcu::Texture2DArray::Texture2DArray(&clampedSource,src);
    lVar5 = 8;
    lVar4 = 0;
    for (lVar6 = 0;
        lVar6 < (int)(((long)clampedSource.super_TextureLevelPyramid.m_access.
                             super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)clampedSource.super_TextureLevelPyramid.m_access.
                            super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                            ._M_impl.super__Vector_impl_data._M_start) / 0x28); lVar6 = lVar6 + 1) {
      if (*(long *)(CONCAT44(clampedSource.super_TextureLevelPyramid.m_data.
                             super__Vector_base<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
                             ._M_impl.super__Vector_impl_data._M_start._4_4_,
                             clampedSource.super_TextureLevelPyramid.m_data.
                             super__Vector_base<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
                             ._M_impl.super__Vector_impl_data._M_start._0_4_) + lVar5) != 0) {
        clampFloatingPointTexture
                  ((PixelBufferAccess *)
                   ((long)((clampedSource.super_TextureLevelPyramid.m_access.
                            super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                            ._M_impl.super__Vector_impl_data._M_start)->super_ConstPixelBufferAccess
                          ).m_size.m_data + lVar4 + -8));
      }
      lVar4 = lVar4 + 0x28;
      lVar5 = lVar5 + 0x10;
    }
    tcu::SurfaceAccess::SurfaceAccess((SurfaceAccess *)&local_240,&reference,pixelFormat);
    sampleParams_00 = local_2b0;
    local_2f8._0_4_ = clampedSource.m_view.m_numLevels;
    local_2f8._8_8_ = clampedSource.m_view.m_levels;
    glu::TextureTestUtil::sampleTexture
              ((SurfaceAccess *)&local_240,(Texture2DArrayView *)local_2f8,local_328,local_2b0);
    this_00 = local_2a0;
    comparePrec_00 = local_2a8;
    tcu::Surface::getAccess((PixelBufferAccess *)&local_240,&reference);
    tcu::Surface::getAccess((PixelBufferAccess *)local_2f8,&errorMask);
    src_00 = &local_2d0;
    local_2d0._M_dataplus._M_p._0_4_ = clampedSource.m_view.m_numLevels;
    local_2d0._M_string_length = (size_type)clampedSource.m_view.m_levels;
    iVar2 = glu::TextureTestUtil::computeTextureCompareDiff
                      (result,(ConstPixelBufferAccess *)&local_240,(PixelBufferAccess *)local_2f8,
                       (Texture2DArrayView *)src_00,local_328,sampleParams_00,comparePrec_00,lodPrec
                       ,&local_320);
    tcu::Texture3D::~Texture3D((Texture3D *)&clampedSource);
  }
  else {
    tcu::SurfaceAccess::SurfaceAccess((SurfaceAccess *)&clampedSource,&reference,pixelFormat);
    local_240.m_name._M_dataplus._M_p._0_4_ = (src->m_view).m_numLevels;
    local_240.m_name._M_string_length = (size_type)(src->m_view).m_levels;
    glu::TextureTestUtil::sampleTexture
              ((SurfaceAccess *)&clampedSource,(Texture2DArrayView *)&local_240,local_328,
               sampleParams);
    tcu::Surface::getAccess((PixelBufferAccess *)&clampedSource,&reference);
    tcu::Surface::getAccess((PixelBufferAccess *)&local_240,&errorMask);
    local_2f8._8_8_ = (src->m_view).m_levels;
    src_00 = (string *)local_2f8;
    local_2f8._0_4_ = (src->m_view).m_numLevels;
    iVar2 = glu::TextureTestUtil::computeTextureCompareDiff
                      (result,(ConstPixelBufferAccess *)&clampedSource,
                       (PixelBufferAccess *)&local_240,(Texture2DArrayView *)src_00,local_328,
                       sampleParams,comparePrec,lodPrec,&local_320);
  }
  __fd = (ChannelOrder)this_00;
  if (0 < iVar2) {
    this = &clampedSource.super_TextureLevelPyramid.m_data;
    clampedSource.super_TextureLevelPyramid.m_format.type = (ChannelType)((ulong)this_00 >> 0x20);
    clampedSource.super_TextureLevelPyramid.m_format.order = __fd;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)this);
    std::operator<<((ostream *)this,"ERROR: Result verification failed, got ");
    std::ostream::operator<<(this,iVar2);
    std::operator<<((ostream *)this," invalid pixels!");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&clampedSource,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)this);
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)local_2f8,"VerifyResult",&local_329);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2d0,"Verification result",&local_32a);
  tcu::LogImageSet::LogImageSet((LogImageSet *)&local_240,(string *)local_2f8,&local_2d0);
  tcu::LogImageSet::write((LogImageSet *)&local_240,__fd,__buf,(size_t)src_00);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_278,"Rendered",&local_32b);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_298,"Rendered image",&local_32c);
  tcu::LogImage::LogImage
            ((LogImage *)&clampedSource,&local_278,&local_298,result,QP_IMAGE_COMPRESSION_MODE_BEST)
  ;
  tcu::LogImage::write((LogImage *)&clampedSource,__fd,__buf_00,(size_t)result);
  tcu::LogImage::~LogImage((LogImage *)&clampedSource);
  std::__cxx11::string::~string((string *)&local_298);
  std::__cxx11::string::~string((string *)&local_278);
  tcu::LogImageSet::~LogImageSet((LogImageSet *)&local_240);
  std::__cxx11::string::~string((string *)&local_2d0);
  std::__cxx11::string::~string((string *)local_2f8);
  if (0 < iVar2) {
    std::__cxx11::string::string<std::allocator<char>>((string *)local_2f8,"Reference",&local_329);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2d0,"Ideal reference image",&local_32a);
    pSVar3 = &reference;
    tcu::LogImage::LogImage
              ((LogImage *)&clampedSource,(string *)local_2f8,&local_2d0,pSVar3,
               QP_IMAGE_COMPRESSION_MODE_BEST);
    tcu::LogImage::write((LogImage *)&clampedSource,__fd,__buf_01,(size_t)pSVar3);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_278,"ErrorMask",&local_32b);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_298,"Error mask",&local_32c)
    ;
    pSVar3 = &errorMask;
    tcu::LogImage::LogImage(&local_240,&local_278,&local_298,pSVar3,QP_IMAGE_COMPRESSION_MODE_BEST);
    tcu::LogImage::write(&local_240,__fd,__buf_02,(size_t)pSVar3);
    tcu::LogImage::~LogImage(&local_240);
    std::__cxx11::string::~string((string *)&local_298);
    std::__cxx11::string::~string((string *)&local_278);
    tcu::LogImage::~LogImage((LogImage *)&clampedSource);
    std::__cxx11::string::~string((string *)&local_2d0);
    std::__cxx11::string::~string((string *)local_2f8);
  }
  tcu::TestLog::endImageSet(this_00);
  tcu::Surface::~Surface(&errorMask);
  tcu::Surface::~Surface(&reference);
  return iVar2 == 0;
}

Assistant:

bool verifyTexCompareResult (tcu::TestContext&						testCtx,
							 const tcu::ConstPixelBufferAccess&		result,
							 const TextureType&						src,
							 const float*							texCoord,
							 const ReferenceParams&					sampleParams,
							 const tcu::TexComparePrecision&		comparePrec,
							 const tcu::LodPrecision&				lodPrec,
							 const tcu::PixelFormat&				pixelFormat)
{
	tcu::TestLog&	log					= testCtx.getLog();
	tcu::Surface	reference			(result.getWidth(), result.getHeight());
	tcu::Surface	errorMask			(result.getWidth(), result.getHeight());
	const tcu::Vec3	nonShadowThreshold	= tcu::computeFixedPointThreshold(getBitsVec(pixelFormat)-1).swizzle(1,2,3);
	int				numFailedPixels;

	// sampleTexture() expects source image to be the same state as it would be in a GL implementation, that is
	// the floating point depth values should be in [0, 1] range as data is clamped during texture upload. Since
	// we don't have a separate "uploading" phase and just reuse the buffer we used for GL-upload, do the clamping
	// here if necessary.

	if (isFloatingPointDepthFormat(src.getFormat()))
	{
		TextureType clampedSource(src);

		clampFloatingPointTexture(clampedSource);

		// sample clamped values

		sampleTexture(tcu::SurfaceAccess(reference, pixelFormat), clampedSource, texCoord, sampleParams);
		numFailedPixels = computeTextureCompareDiff(result, reference.getAccess(), errorMask.getAccess(), clampedSource, texCoord, sampleParams, comparePrec, lodPrec, nonShadowThreshold);
	}
	else
	{
		// sample raw values (they are guaranteed to be in [0, 1] range as the format cannot represent any other values)

		sampleTexture(tcu::SurfaceAccess(reference, pixelFormat), src, texCoord, sampleParams);
		numFailedPixels = computeTextureCompareDiff(result, reference.getAccess(), errorMask.getAccess(), src, texCoord, sampleParams, comparePrec, lodPrec, nonShadowThreshold);
	}

	if (numFailedPixels > 0)
		log << TestLog::Message << "ERROR: Result verification failed, got " << numFailedPixels << " invalid pixels!" << TestLog::EndMessage;

	log << TestLog::ImageSet("VerifyResult", "Verification result")
		<< TestLog::Image("Rendered", "Rendered image", result);

	if (numFailedPixels > 0)
	{
		log << TestLog::Image("Reference", "Ideal reference image", reference)
			<< TestLog::Image("ErrorMask", "Error mask", errorMask);
	}

	log << TestLog::EndImageSet;

	return numFailedPixels == 0;
}